

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

bool __thiscall ON_Buffer::ChangeSize(ON_Buffer *this,ON__UINT64 buffer_size)

{
  bool bVar1;
  undefined1 local_41;
  ON__UINT64 OStack_40;
  uchar zero_byte;
  ON__UINT64 saved_pos;
  ON_BUFFER_SEGMENT *p;
  ON_BUFFER_SEGMENT *p1;
  ON_BUFFER_SEGMENT *p0;
  ON__UINT64 buffer_size_local;
  ON_Buffer *this_local;
  
  p0 = (ON_BUFFER_SEGMENT *)buffer_size;
  buffer_size_local = (ON__UINT64)this;
  if (buffer_size == 0) {
    p1 = this->m_last_segment;
    this->m_buffer_size = 0;
    this->m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
    this->m_last_segment = (ON_BUFFER_SEGMENT *)0x0;
    this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
    while (p1 != (ON_BUFFER_SEGMENT *)0x0) {
      p = p1->m_prev_segment;
      if ((p1->m_segment_buffer != (uchar *)0x0) &&
         ((ON_BUFFER_SEGMENT *)p1->m_segment_buffer != p1 + 1)) {
        onfree(p1->m_segment_buffer);
      }
      onfree(p1);
      p1 = p;
    }
  }
  else if (buffer_size < this->m_buffer_size) {
    this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
    if ((this->m_first_segment == (ON_BUFFER_SEGMENT *)0x0) ||
       (this->m_last_segment == (ON_BUFFER_SEGMENT *)0x0)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x293,"","Corrupt ON_Buffer");
      return false;
    }
    while (this->m_last_segment != (ON_BUFFER_SEGMENT *)0x0) {
      if ((ON_BUFFER_SEGMENT *)this->m_last_segment->m_segment_position0 < p0) {
        if ((ON_BUFFER_SEGMENT *)this->m_last_segment->m_segment_position1 < p0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,0x29d,"","Corrupt ON_Buffer.");
          if (this->m_last_segment->m_segment_position1 < this->m_buffer_size) {
            this->m_buffer_size = this->m_last_segment->m_segment_position1;
          }
          this->m_last_segment->m_next_segment = (ON_BUFFER_SEGMENT *)0x0;
          if (this->m_buffer_size < this->m_current_position) {
            this->m_current_position = this->m_buffer_size;
          }
          return false;
        }
        if ((this->m_last_segment->m_segment_buffer != (uchar *)0x0) &&
           (p0 < (ON_BUFFER_SEGMENT *)this->m_last_segment->m_segment_position1)) {
          memset(this->m_last_segment->m_segment_buffer +
                 ((long)p0 - this->m_last_segment->m_segment_position0),0,
                 this->m_last_segment->m_segment_position1 - (long)p0);
        }
        this->m_buffer_size = (ON__UINT64)p0;
        break;
      }
      saved_pos = (ON__UINT64)this->m_last_segment->m_prev_segment;
      if ((ON_BUFFER_SEGMENT *)saved_pos != (ON_BUFFER_SEGMENT *)0x0) {
        ((ON_BUFFER_SEGMENT *)saved_pos)->m_next_segment = (ON_BUFFER_SEGMENT *)0x0;
      }
      if ((this->m_last_segment->m_segment_buffer != (uchar *)0x0) &&
         ((ON_BUFFER_SEGMENT *)this->m_last_segment->m_segment_buffer != this->m_last_segment + 1))
      {
        onfree(this->m_last_segment->m_segment_buffer);
      }
      onfree(this->m_last_segment);
      this->m_last_segment = (ON_BUFFER_SEGMENT *)saved_pos;
    }
  }
  else if (this->m_buffer_size < buffer_size) {
    OStack_40 = CurrentPosition(this);
    bVar1 = SeekFromStart(this,(ON__INT64)((long)&p0[-1].m_reserved + 7));
    if (bVar1) {
      local_41 = 0;
      Write(this,1,&local_41);
    }
    SeekFromStart(this,OStack_40);
  }
  return p0 == (ON_BUFFER_SEGMENT *)this->m_buffer_size;
}

Assistant:

bool ON_Buffer::ChangeSize(ON__UINT64 buffer_size)
{
  if ( buffer_size <= 0 )
  {
    struct ON_BUFFER_SEGMENT* p0 = m_last_segment;
    struct ON_BUFFER_SEGMENT* p1 = 0;
    m_buffer_size = 0;
    m_first_segment = 0;
    m_last_segment = 0;
    m_current_segment = 0;

    // free in reverse order of allocation
    while ( 0 != p0 )
    {
      p1 = p0->m_prev_segment;
      if ( 0 != p0->m_segment_buffer && (void*)(p0->m_segment_buffer) != (void*)(p0+1) )
        onfree(p0->m_segment_buffer);
      onfree(p0);
      p0 = p1;
    }
  }
  else if ( buffer_size < m_buffer_size )
  {
    m_current_segment = 0;

    if ( 0 == m_first_segment || 0 == m_last_segment )
    {
      ON_ERROR("Corrupt ON_Buffer");
      return false;
    }

    while ( 0 != m_last_segment )
    {
      if ( m_last_segment->m_segment_position0 < buffer_size )
      {
        if ( buffer_size > m_last_segment->m_segment_position1 )
        {
          ON_ERROR("Corrupt ON_Buffer.");
          // Set m_buffer_size and m_last_segment to valid values
          // to prevent possible crashes if the return code is
          // ignored.
          if ( m_buffer_size > m_last_segment->m_segment_position1 )
            m_buffer_size = m_last_segment->m_segment_position1;
          m_last_segment->m_next_segment = 0;
          if ( m_current_position > m_buffer_size )
            m_current_position = m_buffer_size;
          return false;
        }
        if ( 0 != m_last_segment->m_segment_buffer && m_last_segment->m_segment_position1 > buffer_size )
        {
          memset(m_last_segment->m_segment_buffer + (buffer_size - m_last_segment->m_segment_position0),
                 0,
                 (size_t)(m_last_segment->m_segment_position1 - buffer_size)
                 );
        }
        m_buffer_size = buffer_size;
        break;
      }
      struct ON_BUFFER_SEGMENT* p = m_last_segment->m_prev_segment;
      if ( 0 != p )
        p->m_next_segment = 0;
      if ( 0 != m_last_segment->m_segment_buffer && (void*)(m_last_segment->m_segment_buffer) != (void*)(m_last_segment+1) )
        onfree(m_last_segment->m_segment_buffer);
      onfree(m_last_segment);
      m_last_segment = p;
    }
  }
  else if ( buffer_size > m_buffer_size )
  {
    // save current position;
    const ON__UINT64 saved_pos = CurrentPosition();
    if ( SeekFromStart(buffer_size-1) )
    {
      // calling Write with the current position at buffer_size-1
      // will pad with zeros from offset m_buffer_size to 
      // offset buffer_size-2, write a zero at offset buffer_size-1,
      // and set m_buffer_size to buffer size.
      const unsigned char zero_byte = 0;
      Write(1,&zero_byte);
    }
    // restore current position.
    SeekFromStart(saved_pos);
  }

  return (buffer_size == m_buffer_size);
}